

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O0

char * vkb::to_string(PhysicalDeviceError err)

{
  char *pcStack_10;
  PhysicalDeviceError err_local;
  
  switch(err) {
  case no_surface_provided:
    pcStack_10 = "no_surface_provided";
    break;
  case failed_enumerate_physical_devices:
    pcStack_10 = "failed_enumerate_physical_devices";
    break;
  case no_physical_devices_found:
    pcStack_10 = "no_physical_devices_found";
    break;
  case no_suitable_device:
    pcStack_10 = "no_suitable_device";
    break;
  default:
    pcStack_10 = "";
  }
  return pcStack_10;
}

Assistant:

const char* to_string(PhysicalDeviceError err) {
    switch (err) {
        CASE_TO_STRING(PhysicalDeviceError, no_surface_provided)
        CASE_TO_STRING(PhysicalDeviceError, failed_enumerate_physical_devices)
        CASE_TO_STRING(PhysicalDeviceError, no_physical_devices_found)
        CASE_TO_STRING(PhysicalDeviceError, no_suitable_device)
        default:
            return "";
    }
}